

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall CLIntercept::dumpProgramBinary(CLIntercept *this,cl_program program)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  char *pcVar6;
  size_t sVar7;
  pthread_mutex_t *__mutex;
  int iVar8;
  cl_int cVar9;
  mapped_type *pmVar10;
  long lVar11;
  void *__s;
  void *pvVar12;
  void *pvVar13;
  long *plVar14;
  undefined8 uVar15;
  long *plVar16;
  ulong uVar17;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar19;
  size_t numDevices;
  cl_device_type deviceType;
  string fileName;
  char numberString [256];
  size_t local_1c0;
  ulong local_1b8;
  cl_program local_1b0;
  void *local_1a8;
  pthread_mutex_t *local_1a0;
  string local_198;
  long *local_178;
  long local_170;
  long local_168;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [8];
  
  local_1b0 = program;
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar8 != 0) {
    uVar15 = std::__throw_system_error(iVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    pthread_mutex_unlock(local_1a0);
    _Unwind_Resume(uVar15);
  }
  local_1a0 = (pthread_mutex_t *)&this->m_Mutex;
  pmVar10 = std::
            map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
            ::operator[](&this->m_ProgramInfoMap,&local_1b0);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  local_198._M_string_length = 0;
  local_198.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)local_138,sc_DumpDirectoryName,(allocator *)&local_178);
  OS::Services_Common::GetDumpDirectoryName
            (&(this->m_OS).super_Services_Common,local_138,&local_198);
  paVar1 = &local_138[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_138[0]._M_dataplus._M_p);
  }
  memset(local_138,0,0x100);
  if ((this->m_Config).OmitProgramNumber == true) {
    uVar2 = pmVar10->CompileCount;
    uVar3 = (uint)pmVar10->ProgramHash;
    uVar4 = (uint)pmVar10->OptionsHash;
    pcVar6 = "$%08X_%04u_%08X";
  }
  else {
    uVar2 = (uint)pmVar10->ProgramHash;
    uVar3 = pmVar10->ProgramNumber;
    uVar4 = pmVar10->CompileCount;
    pcVar6 = "$%04u_%08X_%04u_%08X";
  }
  snprintf((char *)local_138,0x100,pcVar6 + 1,(ulong)uVar3,(ulong)uVar2,(ulong)uVar4);
  std::__cxx11::string::append((char *)&local_198);
  std::__cxx11::string::append((char *)&local_198);
  lVar11 = std::__cxx11::string::find((char *)&local_198,0x19e01b,0);
  lVar11 = std::__cxx11::string::find((char *)&local_198,0x19e01b,lVar11 + 1);
  if (lVar11 != -1) {
    do {
      std::__cxx11::string::substr((ulong)local_138,(ulong)&local_198);
      mkdir(local_138[0]._M_dataplus._M_p,0x1ff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_138[0]._M_dataplus._M_p);
      }
      lVar11 = std::__cxx11::string::find((char *)&local_198,0x19e01b,lVar11 + 1);
    } while (lVar11 != -1);
  }
  local_1c0 = 0;
  cVar9 = (*(this->m_Dispatch).clGetProgramInfo)(local_1b0,0x1163,0,(void *)0x0,&local_1c0);
  if (cVar9 == 0) {
    uVar17 = local_1c0 & 0xfffffffffffffff8;
    local_1c0 = local_1c0 >> 3;
    pvVar13 = operator_new__(uVar17);
    __s = operator_new__(uVar17);
    pvVar12 = operator_new__(uVar17);
    sVar7 = local_1c0;
    if (local_1c0 != 0) {
      memset(__s,0,local_1c0 * 8);
    }
    cVar9 = (*(this->m_Dispatch).clGetProgramInfo)
                      (local_1b0,0x1163,sVar7 << 3,pvVar13,(size_t *)0x0);
    if ((cVar9 == 0) &&
       (cVar9 = (*(this->m_Dispatch).clGetProgramInfo)
                          (local_1b0,0x1165,local_1c0 << 3,pvVar12,(size_t *)0x0), sVar7 = local_1c0
       , cVar9 == 0)) {
      local_1a8 = pvVar13;
      if (local_1c0 != 0) {
        uVar17 = 0;
        do {
          pvVar13 = operator_new__(*(ulong *)((long)pvVar12 + uVar17 * 8));
          *(void **)((long)__s + uVar17 * 8) = pvVar13;
          uVar17 = uVar17 + 1;
        } while (sVar7 != uVar17);
      }
      cVar9 = (*(this->m_Dispatch).clGetProgramInfo)(local_1b0,0x1166,sVar7 << 3,__s,(size_t *)0x0);
      if ((cVar9 == 0) && (local_1c0 != 0)) {
        uVar17 = 0;
        do {
          local_1b8 = 1;
          (*(this->m_Dispatch).clGetDeviceInfo)
                    (*(cl_device_id *)((long)local_1a8 + uVar17 * 8),0x1000,8,&local_1b8,
                     (size_t *)0x0);
          local_138[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_138,local_198._M_dataplus._M_p,
                     local_198._M_dataplus._M_p + local_198._M_string_length);
          if ((local_1b8 & 2) != 0) {
            std::__cxx11::string::append((char *)local_138);
          }
          if ((local_1b8 & 4) != 0) {
            std::__cxx11::string::append((char *)local_138);
          }
          if ((local_1b8 & 8) != 0) {
            std::__cxx11::string::append((char *)local_138);
          }
          if ((local_1b8 & 0x10) != 0) {
            std::__cxx11::string::append((char *)local_138);
          }
          std::__cxx11::string::append((char *)local_138);
          std::operator+(&local_158,"Dumping program binary to file: ",local_138);
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_158);
          local_178 = &local_168;
          plVar16 = plVar14 + 2;
          if ((long *)*plVar14 == plVar16) {
            uVar18 = (undefined4)*plVar16;
            uVar19 = *(undefined4 *)((long)plVar14 + 0x14);
            local_168 = *plVar16;
            uStack_160 = (undefined4)plVar14[3];
            uStack_15c = *(undefined4 *)((long)plVar14 + 0x1c);
          }
          else {
            local_168 = *plVar16;
            uVar18 = extraout_XMM0_Da;
            uVar19 = extraout_XMM0_Db;
            local_178 = (long *)*plVar14;
          }
          local_170 = plVar14[1];
          *plVar14 = (long)plVar16;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          log(this,(double)CONCAT44(uVar19,uVar18));
          if (local_178 != &local_168) {
            operator_delete(local_178);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
          dumpMemoryToFile(this,local_138,false,*(void **)((long)__s + uVar17 * 8),
                           *(size_t *)((long)pvVar12 + uVar17 * 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138[0]._M_dataplus._M_p != paVar1) {
            operator_delete(local_138[0]._M_dataplus._M_p);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < local_1c0);
      }
      pvVar13 = local_1a8;
      if (local_1c0 != 0) {
        uVar17 = 0;
        do {
          pvVar5 = *(void **)((long)__s + uVar17 * 8);
          if (pvVar5 != (void *)0x0) {
            operator_delete__(pvVar5);
          }
          *(undefined8 *)((long)__s + uVar17 * 8) = 0;
          uVar17 = uVar17 + 1;
        } while (uVar17 < local_1c0);
      }
    }
  }
  else {
    pvVar13 = (void *)0x0;
    __s = (void *)0x0;
    pvVar12 = (void *)0x0;
  }
  if (pvVar13 != (void *)0x0) {
    operator_delete__(pvVar13);
  }
  __mutex = local_1a0;
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  if (pvVar12 != (void *)0x0) {
    operator_delete__(pvVar12);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void CLIntercept::dumpProgramBinary(
    const cl_program program )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

    std::string     fileName;

    // Get the dump directory name.
    {
        OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
    }
    // Make the file name.  It will have the form:
    //   CLI_<program number>_<program hash>_<compile count>_<options hash>
    // Leave off the extension for now.
    {
        char    numberString[256] = "";

        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X_%04u_%08X",
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X_%04u_%08X",
                programInfo.ProgramNumber,
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }

        fileName += "/CLI_";
        fileName += numberString;
    }
    // Now make directories as appropriate.
    {
        OS().MakeDumpDirectories( fileName );
    }

    cl_int  errorCode = CL_SUCCESS;

    size_t  numDevices = 0;

    if( errorCode == CL_SUCCESS )
    {
        // Get all of the devices associated with this program.
        errorCode = dispatch().clGetProgramInfo(
            program,
            CL_PROGRAM_DEVICES,
            0,
            NULL,
            &numDevices );
    }

    cl_device_id*   devices = NULL;
    char**          programBinaries = NULL;
    size_t*         programBinarySizes = NULL;

    if( errorCode == CL_SUCCESS )
    {
        numDevices /= sizeof( cl_device_id );

        devices = new cl_device_id[ numDevices ];
        programBinaries = new char*[ numDevices ];
        programBinarySizes = new size_t[ numDevices ];

        if( ( devices == NULL ) ||
            ( programBinaries == NULL ) ||
            ( programBinarySizes == NULL ) )
        {
            CLI_ASSERT( 0 );
            errorCode = CL_OUT_OF_HOST_MEMORY;
        }
    }

    if( errorCode == CL_SUCCESS )
    {
        for( size_t i = 0; i < numDevices; i++ )
        {
            programBinaries[i] = NULL;
        }

        errorCode = dispatch().clGetProgramInfo(
            program,
            CL_PROGRAM_DEVICES,
            numDevices * sizeof( cl_device_id ),
            devices,
            NULL );
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetProgramInfo(
            program,
            CL_PROGRAM_BINARY_SIZES,
            numDevices * sizeof( size_t ),
            programBinarySizes,
            NULL );
    }

    if( errorCode == CL_SUCCESS )
    {
        for( size_t i = 0; i < numDevices; i++ )
        {
            programBinaries[ i ] = new char[ programBinarySizes[ i ] ];
            if( programBinaries[ i ] == NULL )
            {
                errorCode = CL_OUT_OF_HOST_MEMORY;
                break;
            }
        }

        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clGetProgramInfo(
                program,
                CL_PROGRAM_BINARIES,
                numDevices * sizeof( char* ),
                programBinaries,
                NULL );
        }

        if( errorCode == CL_SUCCESS )
        {
            for( size_t i = 0; i < numDevices; i++ )
            {
                cl_device_type  deviceType = CL_DEVICE_TYPE_DEFAULT;

                // It's OK if this fails.  If it does, it just
                // means that our output file won't have a device
                // type.
                dispatch().clGetDeviceInfo(
                    devices[ i ],
                    CL_DEVICE_TYPE,
                    sizeof( deviceType ),
                    &deviceType,
                    NULL );

                std::string outputFileName = fileName;

                if( deviceType & CL_DEVICE_TYPE_CPU )
                {
                    outputFileName += "_CPU";
                }
                if( deviceType & CL_DEVICE_TYPE_GPU )
                {
                    outputFileName += "_GPU";
                }
                if( deviceType & CL_DEVICE_TYPE_ACCELERATOR )
                {
                    outputFileName += "_ACC";
                }
                if( deviceType & CL_DEVICE_TYPE_CUSTOM )
                {
                    outputFileName += "_CUSTOM";
                }

                outputFileName += ".bin";

                log( "Dumping program binary to file: " + outputFileName + "\n" );
                dumpMemoryToFile(
                    outputFileName,
                    false,
                    programBinaries[ i ],
                    programBinarySizes[ i ] );
            }
        }

        for( size_t i = 0; i < numDevices; i++ )
        {
            delete [] programBinaries[ i ];
            programBinaries[ i ] = NULL;
        }
    }

    delete [] devices;
    devices = NULL;

    delete [] programBinaries;
    programBinaries = NULL;

    delete [] programBinarySizes;
    programBinarySizes = NULL;
}